

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

int oonf_layer2_neigh_generate_lid
              (oonf_layer2_neigh_key *key,oonf_layer2_origin *origin,netaddr *mac)

{
  uint8_t uVar1;
  uint32_t uVar2;
  long lVar3;
  undefined8 *local_60;
  undefined8 *puStack_50;
  uint32_t u32;
  oonf_layer2_lid *lid;
  netaddr *mac_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_neigh_key *key_local;
  
  if ((origin->lid & 1U) == 0) {
    key_local._4_4_ = -1;
  }
  else if ((mac->_type == '/') || (mac->_type == '0')) {
    lVar3 = avl_find(&_lid_tree);
    if (lVar3 == 0) {
      local_60 = (undefined8 *)0x0;
    }
    else {
      local_60 = (undefined8 *)(lVar3 + -0x18);
    }
    puStack_50 = local_60;
    if (local_60 == (undefined8 *)0x0) {
      puStack_50 = (undefined8 *)oonf_class_malloc(&_lid_class);
      if (puStack_50 == (undefined8 *)0x0) {
        return -1;
      }
      *puStack_50 = *(undefined8 *)mac->_addr;
      puStack_50[1] = *(undefined8 *)(mac->_addr + 8);
      *(undefined2 *)(puStack_50 + 2) = *(undefined2 *)&mac->_type;
      puStack_50[8] = puStack_50;
      avl_insert(&_lid_tree);
      *(undefined4 *)((long)puStack_50 + 0x14) = 1;
    }
    memset(key,0,0x23);
    *(undefined8 *)(key->addr)._addr = *(undefined8 *)mac->_addr;
    *(undefined8 *)((key->addr)._addr + 8) = *(undefined8 *)(mac->_addr + 8);
    uVar1 = mac->_prefix_len;
    (key->addr)._type = mac->_type;
    (key->addr)._prefix_len = uVar1;
    uVar2 = htonl(*(uint32_t *)((long)puStack_50 + 0x14));
    *(uint32_t *)key->link_id = uVar2;
    key->link_id_length = '\x04';
    key->link_id[0] = (uint8_t)origin->lid_index;
    *(int *)((long)puStack_50 + 0x14) = *(int *)((long)puStack_50 + 0x14) + 1;
    key_local._4_4_ = 0;
  }
  else {
    key_local._4_4_ = -1;
  }
  return key_local._4_4_;
}

Assistant:

int
oonf_layer2_neigh_generate_lid(struct oonf_layer2_neigh_key *key,
    struct oonf_layer2_origin *origin, const struct netaddr *mac) {
  struct oonf_layer2_lid *lid;
  uint32_t u32;

  if (!origin->lid) {
    return -1;
  }

  if (netaddr_get_address_family(mac) != AF_MAC48 && netaddr_get_address_family(mac) != AF_EUI64) {
    return -1;
  }

  if (!(lid = avl_find_element(&_lid_tree, mac, lid, _node))) {
    lid = oonf_class_malloc(&_lid_class);
    if (!lid) {
      return -1;
    }

    memcpy(&lid->mac, mac, sizeof(*mac));
    lid->_node.key = &lid->mac;
    avl_insert(&_lid_tree, &lid->_node);
    lid->next_id = 1;
  }

  memset(key, 0, sizeof(*key));

  /* copy mac */
  memcpy(&key->addr, mac, sizeof(*mac));

  /* TODO: make LID length configurable */

  /* generate new link-id */
  u32 = htonl(lid->next_id);
  memcpy(&key->link_id[0], &u32, 4);
  key->link_id_length = 4;

  /* keep track which originator orderer this LID */
  key->link_id[0] = origin->lid_index & 0xff;

  lid->next_id++;
  return 0;
}